

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

Char * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **format_str,Arg *arg)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  runtime_error *prVar5;
  Arg *pAVar6;
  char *pcVar7;
  FormatError *this_00;
  char cVar8;
  char *pcVar9;
  undefined4 uVar10;
  int iVar11;
  undefined4 uVar12;
  Char *s;
  string message;
  char *local_80;
  anon_union_16_12_986ea841_for_Value_0 local_78;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *local_68;
  char *pcStack_60;
  uint local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint local_48;
  char local_44;
  BasicStringRef<char> local_38;
  
  pcVar9 = *format_str;
  local_58 = 0;
  iStack_54 = 0x20;
  uStack_50 = 0;
  uStack_4c = 0;
  local_48 = 0xffffffff;
  local_44 = '\0';
  local_80 = pcVar9;
  if (*pcVar9 == ':') {
    if (arg->type == CUSTOM) {
      (*(arg->super_Value).field_0.custom.format)
                (this,(void *)(arg->super_Value).field_0.long_long_value,&local_80);
      return local_80;
    }
    local_80 = pcVar9 + 1;
    bVar1 = pcVar9[1];
    iVar11 = (int)(char)bVar1;
    if (iVar11 == 0) goto LAB_001600f0;
    bVar2 = pcVar9[2];
    if (bVar2 < 0x3e) {
      if (bVar2 == 0x3c) {
        uStack_50 = 1;
        goto LAB_0015fc0c;
      }
      if (bVar2 == 0x3d) {
        bVar3 = true;
        uStack_50 = 4;
        goto LAB_0015fc0e;
      }
LAB_0015fbc9:
      pcVar9 = pcVar9 + 2;
      if (bVar1 < 0x3e) {
        if (bVar1 == 0x3c) {
          uStack_50 = 1;
          local_80 = pcVar9;
          goto LAB_0015fcd2;
        }
        if (bVar1 != 0x3d) goto LAB_0015fcd2;
        uStack_50 = 4;
LAB_0015fc43:
        local_38.data_ = (char *)CONCAT71(local_38.data_._1_7_,0x3d);
        local_80 = pcVar9;
        if (9 < (int)arg->type) {
          format<char>((string *)&local_78.string,(CStringRef)0x1a05d2,(char *)&local_38);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,local_78.string.value);
          *(undefined ***)prVar5 = &PTR__FormatError_001e7ca8;
          __cxa_throw(prVar5,&FormatError::typeinfo,FormatError::~FormatError);
        }
      }
      else if (bVar1 == 0x3e) {
        uStack_50 = 2;
        local_80 = pcVar9;
      }
      else if (bVar1 == 0x5e) {
        uStack_50 = 3;
        local_80 = pcVar9;
      }
    }
    else {
      if (bVar2 == 0x5e) {
        uStack_50 = 3;
      }
      else {
        if (bVar2 != 0x3e) goto LAB_0015fbc9;
        uStack_50 = 2;
      }
LAB_0015fc0c:
      bVar3 = false;
LAB_0015fc0e:
      if (bVar1 != 0x7d) {
        if (bVar1 == 0x7b) {
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x1a04f9);
          goto LAB_00160151;
        }
        pcVar9 = pcVar9 + 3;
        local_80 = pcVar9;
        iStack_54 = iVar11;
        if (bVar3) goto LAB_0015fc43;
      }
    }
LAB_0015fcd2:
    cVar8 = *local_80;
    if (cVar8 == ' ') {
      uVar10 = 9;
      uVar12 = 1;
LAB_0015fd09:
      internal::check_sign<char>(&local_80,arg);
      cVar8 = *local_80;
      uStack_4c = uVar12;
    }
    else {
      if (cVar8 == '+') {
        uVar10 = 0xb;
        uVar12 = 3;
        goto LAB_0015fd09;
      }
      if (cVar8 == '-') {
        uVar10 = 0xc;
        uVar12 = 4;
        goto LAB_0015fd09;
      }
      uVar10 = 8;
    }
    if (cVar8 == '#') {
      local_38.data_ = (char *)CONCAT71(local_38.data_._1_7_,0x23);
      if (9 < (int)arg->type) {
        format<char>((string *)&local_78.string,(CStringRef)0x1a05d2,(char *)&local_38);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,local_78.string.value);
        *(undefined ***)prVar5 = &PTR__FormatError_001e7ca8;
        __cxa_throw(prVar5,&FormatError::typeinfo,FormatError::~FormatError);
      }
      cVar8 = local_80[1];
      local_80 = local_80 + 1;
      uStack_4c = uVar10;
    }
    if (cVar8 == '0') {
      local_38.data_ = (char *)CONCAT71(local_38.data_._1_7_,0x30);
      if (9 < (int)arg->type) {
        format<char>((string *)&local_78.string,(CStringRef)0x1a05d2,(char *)&local_38);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,local_78.string.value);
        *(undefined ***)prVar5 = &PTR__FormatError_001e7ca8;
        __cxa_throw(prVar5,&FormatError::typeinfo,FormatError::~FormatError);
      }
      iStack_54 = 0x30;
      uStack_50 = 4;
      cVar8 = local_80[1];
      local_80 = local_80 + 1;
    }
    if ((byte)(cVar8 - 0x30U) < 10) {
      local_58 = internal::parse_nonnegative_int<char>(&local_80);
    }
    else {
      if (cVar8 != '{') goto LAB_0015ff0f;
      pcVar9 = local_80 + 1;
      if ((local_80[1] == 0x5f) || ((byte)((local_80[1] & 0xdfU) + 0xbf) < 0x1a)) {
        local_38.size_ = 0;
        do {
          do {
            lVar4 = local_38.size_ + 2;
            bVar1 = local_80[local_38.size_ + 2];
            local_38.size_ = local_38.size_ + 1;
          } while ((byte)(bVar1 - 0x30) < 10);
        } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
        local_38.data_ = pcVar9;
        if ((this->super_FormatterBase).next_arg_index_ < 1) {
          (this->super_FormatterBase).next_arg_index_ = -1;
          local_80 = local_80 + lVar4;
          internal::ArgMap<char>::init(&this->map_,(EVP_PKEY_CTX *)this);
          pAVar6 = internal::ArgMap<char>::find(&this->map_,&local_38);
          if (pAVar6 != (Arg *)0x0) {
            local_78.long_long_value = (pAVar6->super_Value).field_0.long_long_value;
            local_78.string.size = (pAVar6->super_Value).field_0.string.size;
            local_68 = *(BasicFormatter<char,_fmt::ArgFormatter<char>_> **)&pAVar6->type;
            pcStack_60 = *(char **)&pAVar6->field_0x18;
            goto LAB_0015fe66;
          }
          pcVar9 = "argument not found";
        }
        else {
          pcVar9 = "cannot switch from automatic to manual argument indexing";
          local_80 = local_80 + lVar4;
        }
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)pcVar9);
        goto LAB_00160151;
      }
      local_80 = pcVar9;
      parse_arg_index((Arg *)&local_78.string,this,&local_80);
LAB_0015fe66:
      pcVar9 = local_80 + 1;
      if (*local_80 != '}') {
        local_80 = pcVar9;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x1a0498);
        goto LAB_00160151;
      }
      pcVar7 = local_78.string.value;
      switch(local_68._0_4_) {
      case 2:
        pcVar7 = (char *)(long)local_78.int_value;
        if ((long)pcVar7 < 0) {
          local_80 = pcVar9;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x1a0514);
          goto LAB_00160151;
        }
        goto LAB_0015ff0b;
      case 3:
        pcVar7 = (char *)(local_78.ulong_long_value & 0xffffffff);
        break;
      case 4:
        if (local_78.long_long_value < 0) {
          local_80 = pcVar9;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x1a0514);
          goto LAB_00160151;
        }
        break;
      case 5:
        break;
      default:
        local_80 = pcVar9;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x1a0523);
        goto LAB_00160151;
      }
      if ((ulong)pcVar7 >> 0x1f != 0) {
        local_80 = pcVar9;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x1a04e7);
        goto LAB_00160151;
      }
LAB_0015ff0b:
      local_58 = (uint)pcVar7;
      local_80 = pcVar9;
    }
LAB_0015ff0f:
    cVar8 = *local_80;
    if (cVar8 == '.') {
      local_48 = 0;
      if ((byte)(local_80[1] - 0x30U) < 10) {
        local_80 = local_80 + 1;
        local_48 = internal::parse_nonnegative_int<char>(&local_80);
      }
      else {
        if (local_80[1] != '{') {
          local_80 = local_80 + 1;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x1a0564);
          goto LAB_00160151;
        }
        pcVar9 = local_80 + 2;
        if ((local_80[2] == 0x5f) || ((byte)((local_80[2] & 0xdfU) + 0xbf) < 0x1a)) {
          local_38.size_ = 0;
          do {
            do {
              lVar4 = local_38.size_ + 3;
              bVar1 = local_80[local_38.size_ + 3];
              local_38.size_ = local_38.size_ + 1;
            } while ((byte)(bVar1 - 0x30) < 10);
          } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
          local_38.data_ = pcVar9;
          if ((this->super_FormatterBase).next_arg_index_ < 1) {
            (this->super_FormatterBase).next_arg_index_ = -1;
            local_80 = local_80 + lVar4;
            internal::ArgMap<char>::init(&this->map_,(EVP_PKEY_CTX *)this);
            pAVar6 = internal::ArgMap<char>::find(&this->map_,&local_38);
            if (pAVar6 != (Arg *)0x0) {
              local_78.long_long_value = (pAVar6->super_Value).field_0.long_long_value;
              local_78.string.size = (pAVar6->super_Value).field_0.string.size;
              local_68 = *(BasicFormatter<char,_fmt::ArgFormatter<char>_> **)&pAVar6->type;
              pcStack_60 = *(char **)&pAVar6->field_0x18;
              goto LAB_0016000b;
            }
            pcVar9 = "argument not found";
          }
          else {
            pcVar9 = "cannot switch from automatic to manual argument indexing";
            local_80 = local_80 + lVar4;
          }
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)pcVar9);
          goto LAB_00160151;
        }
        local_80 = pcVar9;
        parse_arg_index((Arg *)&local_78.string,this,&local_80);
LAB_0016000b:
        pcVar9 = local_80 + 1;
        if (*local_80 != '}') {
          local_80 = pcVar9;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x1a0498);
          goto LAB_00160151;
        }
        pcVar7 = (char *)local_78.long_long_value;
        switch(local_68._0_4_) {
        case 2:
          pcVar7 = (char *)(long)local_78.int_value;
          if ((long)pcVar7 < 0) {
            local_80 = pcVar9;
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x1a0538);
            goto LAB_00160151;
          }
          goto LAB_001600b0;
        case 3:
          pcVar7 = (char *)(local_78.ulong_long_value & 0xffffffff);
          break;
        case 4:
          if (local_78.long_long_value < 0) {
            local_80 = pcVar9;
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x1a0538);
            goto LAB_00160151;
          }
          break;
        case 5:
          break;
        default:
          local_80 = pcVar9;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x1a054b);
          goto LAB_00160151;
        }
        if ((ulong)pcVar7 >> 0x1f != 0) {
          local_80 = pcVar9;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x1a04e7);
          goto LAB_00160151;
        }
LAB_001600b0:
        local_48 = (uint)pcVar7;
        local_80 = pcVar9;
      }
      if (((int)arg->type < 8) || (arg->type == POINTER)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar9 = "integer";
        if (arg->type == POINTER) {
          pcVar9 = "pointer";
        }
        format<char[8]>((string *)&local_78.string,(CStringRef)0x1a0580,(char (*) [8])pcVar9);
        std::runtime_error::runtime_error(prVar5,local_78.string.value);
        *(undefined ***)prVar5 = &PTR__FormatError_001e7ca8;
        __cxa_throw(prVar5,&FormatError::typeinfo,FormatError::~FormatError);
      }
      cVar8 = *local_80;
    }
    if ((cVar8 != '\0') && (cVar8 != '}')) {
      local_44 = *local_80;
      local_80 = local_80 + 1;
    }
  }
LAB_001600f0:
  if (*local_80 == '}') {
    local_78.long_long_value = (LongLong)this->writer_;
    local_78.custom.format = (FormatFunc)&local_58;
    pcStack_60 = local_80;
    local_80 = local_80 + 1;
    local_68 = this;
    ArgVisitor<fmt::ArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::ArgFormatter<char>,_void> *)&local_78.string,arg);
    return local_80;
  }
  local_80 = local_80 + 1;
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this_00,(CStringRef)0x1a05b5);
LAB_00160151:
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

const Char *BasicFormatter<Char, ArgFormatter>::format(
    const Char *&format_str, const internal::Arg &arg) {
  using internal::Arg;
  const Char *s = format_str;
  FormatSpec spec;
  if (*s == ':') {
    if (arg.type == Arg::CUSTOM) {
      arg.custom.format(this, arg.custom.value, &s);
      return s;
    }
    ++s;
    // Parse fill and alignment.
    if (Char c = *s) {
      const Char *p = s + 1;
      spec.align_ = ALIGN_DEFAULT;
      do {
        switch (*p) {
          case '<':
            spec.align_ = ALIGN_LEFT;
            break;
          case '>':
            spec.align_ = ALIGN_RIGHT;
            break;
          case '=':
            spec.align_ = ALIGN_NUMERIC;
            break;
          case '^':
            spec.align_ = ALIGN_CENTER;
            break;
        }
        if (spec.align_ != ALIGN_DEFAULT) {
          if (p != s) {
            if (c == '}') break;
            if (c == '{')
              FMT_THROW(FormatError("invalid fill character '{'"));
            s += 2;
            spec.fill_ = c;
          } else ++s;
          if (spec.align_ == ALIGN_NUMERIC)
            require_numeric_argument(arg, '=');
          break;
        }
      } while (--p >= s);
    }

    // Parse sign.
    switch (*s) {
      case '+':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '-':
        check_sign(s, arg);
        spec.flags_ |= MINUS_FLAG;
        break;
      case ' ':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG;
        break;
    }

    if (*s == '#') {
      require_numeric_argument(arg, '#');
      spec.flags_ |= HASH_FLAG;
      ++s;
    }

    // Parse zero flag.
    if (*s == '0') {
      require_numeric_argument(arg, '0');
      spec.align_ = ALIGN_NUMERIC;
      spec.fill_ = '0';
      ++s;
    }

    // Parse width.
    if ('0' <= *s && *s <= '9') {
      spec.width_ = internal::parse_nonnegative_int(s);
    } else if (*s == '{') {
      ++s;
      Arg width_arg = internal::is_name_start(*s) ?
            parse_arg_name(s) : parse_arg_index(s);
      if (*s++ != '}')
        FMT_THROW(FormatError("invalid format string"));
      ULongLong value = 0;
      switch (width_arg.type) {
      case Arg::INT:
        if (width_arg.int_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.int_value;
        break;
      case Arg::UINT:
        value = width_arg.uint_value;
        break;
      case Arg::LONG_LONG:
        if (width_arg.long_long_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.long_long_value;
        break;
      case Arg::ULONG_LONG:
        value = width_arg.ulong_long_value;
        break;
      default:
        FMT_THROW(FormatError("width is not integer"));
      }
      if (value > (std::numeric_limits<int>::max)())
        FMT_THROW(FormatError("number is too big"));
      spec.width_ = static_cast<int>(value);
    }

    // Parse precision.
    if (*s == '.') {
      ++s;
      spec.precision_ = 0;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = internal::parse_nonnegative_int(s);
      } else if (*s == '{') {
        ++s;
        Arg precision_arg = internal::is_name_start(*s) ?
              parse_arg_name(s) : parse_arg_index(s);
        if (*s++ != '}')
          FMT_THROW(FormatError("invalid format string"));
        ULongLong value = 0;
        switch (precision_arg.type) {
          case Arg::INT:
            if (precision_arg.int_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.int_value;
            break;
          case Arg::UINT:
            value = precision_arg.uint_value;
            break;
          case Arg::LONG_LONG:
            if (precision_arg.long_long_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.long_long_value;
            break;
          case Arg::ULONG_LONG:
            value = precision_arg.ulong_long_value;
            break;
          default:
            FMT_THROW(FormatError("precision is not integer"));
        }
        if (value > (std::numeric_limits<int>::max)())
          FMT_THROW(FormatError("number is too big"));
        spec.precision_ = static_cast<int>(value);
      } else {
        FMT_THROW(FormatError("missing precision specifier"));
      }
      if (arg.type <= Arg::LAST_INTEGER_TYPE || arg.type == Arg::POINTER) {
        FMT_THROW(FormatError(
            fmt::format("precision not allowed in {} format specifier",
            arg.type == Arg::POINTER ? "pointer" : "integer")));
      }
    }

    // Parse type.
    if (*s != '}' && *s)
      spec.type_ = static_cast<char>(*s++);
  }

  if (*s++ != '}')
    FMT_THROW(FormatError("missing '}' in format string"));

  // Format argument.
  ArgFormatter(*this, spec, s - 1).visit(arg);
  return s;
}